

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsdefobj(prscxdef *ctx,tokdef *tok,int typ)

{
  mcmcxdef *ctx_00;
  long lVar1;
  long in_RSI;
  long in_RDI;
  uchar *p;
  int in_stack_00000010;
  mcmon newobj;
  mcmcxdef *in_stack_00000028;
  mcmon in_stack_ffffffffffffffde;
  ushort local_16;
  
  ctx_00 = (mcmcxdef *)mcmalo0(in_stack_00000028,ctx._6_2_,(mcmon *)tok,typ._2_2_,in_stack_00000010)
  ;
  memset(ctx_00,0,0xe);
  (**(code **)(*(long *)(*(long *)(in_RDI + 8) + 0x18) + 0x10))
            (*(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
             (undefined1 *)((long)&ctx_00->mcmcxmsz + 2),0xf2);
  lVar1 = *(long *)(*(long *)**(undefined8 **)(in_RDI + 0x20) +
                   (long)((int)(uint)*(ushort *)
                                      (*(long *)(*(long *)(in_RDI + 0x20) + 0x30 +
                                                (long)((int)(uint)local_16 >> 8) * 8) +
                                      (long)(int)(local_16 & 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (*(long *)(*(long *)(in_RDI + 0x20) + 0x30 +
                                 (long)((int)(uint)local_16 >> 8) * 8) +
                       (long)(int)(local_16 & 0xff) * 2) & 0xff) * 0x20;
  *(ushort *)(lVar1 + 0x14) = *(ushort *)(lVar1 + 0x14) | 1;
  mcmunlck(ctx_00,in_stack_ffffffffffffffde);
  *(ushort *)(in_RSI + 0x42) = local_16;
  return;
}

Assistant:

void prsdefobj(prscxdef *ctx, tokdef *tok, int typ)
{
    mcmon  newobj;
    uchar *p;

    /* allocate the object and clear its memory */
    p = mcmalo(ctx->prscxmem, (ushort)PRSOBJSIZ, &newobj);
    memset(p, 0, (size_t)OBJDEFSIZ);

    /* save the line position after the object header */
    linppos(ctx->prscxtok->tokcxlin, (char *)p + OBJDEFSIZ,
            (uint)(PRSOBJSIZ - OBJDEFSIZ));

#ifdef OS_ERRLINE
    /* save the source line for error displays later on */
    {
        int   len;
        int   need;

                    /* compute how much space we'll need for the line */
        len = ctx->prscxtok->tokcxlin->linlen + 1;
        need = len + OBJDEFSIZ
               + strlen((char *)p + OBJDEFSIZ) + 1;

                    /* reallocate the object if we need more room */
        if (need > PRSOBJSIZ)
            p = mcmrealo(ctx->prscxmem, newobj, need);

                    /* copy the line */
        p += OBJDEFSIZ;
        p += strlen((char *)p) + 1;
        memcpy(p, ctx->prscxtok->tokcxlin->linbuf, (size_t)len);
        p[len] = '\0';
    }
#endif

    /* unlock the object */
    mcmtch(ctx->prscxmem, newobj);
    mcmunlck(ctx->prscxmem, newobj);

    /* set the symbol to point to the new object */
    tok->toksym.toksval = newobj;
}